

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

HeapType __thiscall
wasm::anon_unknown_0::RecGroupStore::insert
          (RecGroupStore *this,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  bool bVar1;
  pointer pHVar2;
  HeapType HVar3;
  lock_guard<std::recursive_mutex> local_60;
  lock_guard<std::recursive_mutex> storeLock;
  RecGroup local_50;
  RecGroup canonical;
  HeapType local_38;
  RecGroup local_30;
  RecGroup group;
  lock_guard<std::mutex> lock;
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  *info_local;
  RecGroupStore *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&group,&this->mutex);
  pHVar2 = std::
           unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
           ::operator->(info);
  if (pHVar2->recGroup == (RecGroupInfo_conflict *)0x0) {
    local_38 = asHeapType(info);
    storeLock._M_device = (mutex_type *)HeapType::getRecGroup(&local_38);
    local_30 = (RecGroup)storeLock._M_device;
    local_50 = insert(this,(RecGroup)storeLock._M_device);
    bVar1 = RecGroup::operator==(&local_30,&local_50);
    if (bVar1) {
      std::lock_guard<std::recursive_mutex>::lock_guard
                (&local_60,(mutex_type *)wasm::(anonymous_namespace)::globalHeapTypeStoreMutex);
      std::
      vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>,std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>>
      ::
      emplace_back<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>
                ((vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>,std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>>
                  *)wasm::(anonymous_namespace)::globalHeapTypeStore,info);
      std::lock_guard<std::recursive_mutex>::~lock_guard(&local_60);
    }
    HVar3 = RecGroup::operator[](&local_50,0);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&group);
    return (HeapType)HVar3.id;
  }
  __assert_fail("!info->recGroup && \"Unexpected nontrivial rec group\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x24e,
                "HeapType wasm::(anonymous namespace)::RecGroupStore::insert(std::unique_ptr<HeapTypeInfo> &&)"
               );
}

Assistant:

HeapType insert(std::unique_ptr<HeapTypeInfo>&& info) {
    std::lock_guard<std::mutex> lock(mutex);
    assert(!info->recGroup && "Unexpected nontrivial rec group");
    auto group = asHeapType(info).getRecGroup();
    auto canonical = insert(group);
    if (group == canonical) {
      std::lock_guard<std::recursive_mutex> storeLock(globalHeapTypeStoreMutex);
      globalHeapTypeStore.emplace_back(std::move(info));
    }
    return canonical[0];
  }